

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.cc
# Opt level: O0

void absl::anon_unknown_2::WritePadding(ostream *o,size_t pad)

{
  byte bVar1;
  unsigned_long *puVar2;
  unsigned_long local_48;
  unsigned_long local_40;
  size_t n;
  char fill_buf [32];
  size_t pad_local;
  ostream *o_local;
  
  fill_buf._24_8_ = pad;
  bVar1 = std::ios::fill();
  memset(&n,(uint)bVar1,0x20);
  for (; fill_buf._24_8_ != 0; fill_buf._24_8_ = fill_buf._24_8_ - local_40) {
    local_48 = 0x20;
    puVar2 = std::min<unsigned_long>((unsigned_long *)(fill_buf + 0x18),&local_48);
    local_40 = *puVar2;
    std::ostream::write((char *)o,(long)&n);
  }
  return;
}

Assistant:

void WritePadding(std::ostream& o, size_t pad) {
  char fill_buf[32];
  memset(fill_buf, o.fill(), sizeof(fill_buf));
  while (pad) {
    size_t n = std::min(pad, sizeof(fill_buf));
    o.write(fill_buf, n);
    pad -= n;
  }
}